

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::TestEventListeners::TestEventListeners(TestEventListeners *this)

{
  _func_int **pp_Var1;
  TestEventRepeater *in_RDI;
  TestEventRepeater *this_00;
  
  this_00 = in_RDI;
  pp_Var1 = (_func_int **)operator_new(0x28);
  internal::TestEventRepeater::TestEventRepeater(this_00);
  (this_00->super_TestEventListener)._vptr_TestEventListener = pp_Var1;
  *(undefined8 *)&in_RDI->forwarding_enabled_ = 0;
  (in_RDI->listeners_).
  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

TestEventListeners::TestEventListeners()
    : repeater_(new internal::TestEventRepeater()),
      default_result_printer_(NULL),
      default_xml_generator_(NULL) {
}